

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::clear(App *this)

{
  pointer ppAVar1;
  pointer puVar2;
  Option *pOVar3;
  pointer psVar4;
  Option_p *opt;
  pointer puVar5;
  pointer psVar6;
  
  this->parsed_ = 0;
  this->pre_parse_called_ = false;
  std::
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->missing_);
  ppAVar1 = (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppAVar1) {
    (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppAVar1;
  }
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    pOVar3 = (puVar5->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pOVar3->results_);
    pOVar3->current_option_state_ = parsing;
  }
  psVar4 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar4; psVar6 = psVar6 + 1) {
    clear((psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  return;
}

Assistant:

CLI11_INLINE void App::clear() {

    parsed_ = 0;
    pre_parse_called_ = false;

    missing_.clear();
    parsed_subcommands_.clear();
    for(const Option_p &opt : options_) {
        opt->clear();
    }
    for(const App_p &subc : subcommands_) {
        subc->clear();
    }
}